

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugEventObject.cpp
# Opt level: O0

void __thiscall
JsrtDebugDocumentManager::ClearDebugDocument
          (JsrtDebugDocumentManager *this,ScriptContext *scriptContext)

{
  ScriptContext *scriptContext_local;
  JsrtDebugDocumentManager *this_local;
  
  if (scriptContext != (ScriptContext *)0x0) {
    Js::ScriptContext::
    MapScript<JsrtDebugDocumentManager::ClearDebugDocument(Js::ScriptContext*)::__0>
              (scriptContext,(anon_class_8_1_8991fb9c_for_mapper)this);
  }
  return;
}

Assistant:

void JsrtDebugDocumentManager::ClearDebugDocument(Js::ScriptContext * scriptContext)
{
    if (scriptContext != nullptr)
    {
        scriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo)
        {
            if (sourceInfo->HasDebugDocument())
            {
                Js::DebugDocument* debugDocument = sourceInfo->GetDebugDocument();

                // Remove the debugdocument from breakpoint dictionary
                if (this->breakpointDebugDocumentDictionary != nullptr)
                {
                    this->breakpointDebugDocumentDictionary->MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<UINT, Js::DebugDocument *> keyValue)
                    {
                        if (keyValue.Value() != nullptr && keyValue.Value() == debugDocument)
                        {
                            return true;
                        }
                        return false;
                    });
                }

                debugDocument->GetUtf8SourceInfo()->ClearDebugDocument();
                HeapDelete(debugDocument);
                debugDocument = nullptr;
            }
        });
    }
}